

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O2

void __thiscall
pbrt::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,CameraBaseParameters *baseParameters,Float fov,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  Transform *this_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  uintptr_t iptr;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar12 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  ulong in_XMM4_Qa;
  Point3<float> PVar13;
  Point3<float> PVar14;
  Vector3<float> VVar15;
  Tuple3<pbrt::Point3,_float> local_410;
  CameraHandle local_400;
  Transform local_3f8;
  CameraBaseParameters local_378;
  
  memcpy(&local_378,baseParameters,0x340);
  local_378.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_378.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Perspective(&local_3f8,fov,0.01,1000.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_378,&local_3f8,screenWindow,lensRadius,
             focalDistance);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  this_00 = &(this->super_ProjectiveCamera).cameraFromRaster;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  auVar12 = (undefined1  [56])0x0;
  local_3f8.m.m[0]._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_3f8.m.m[0][2] = 0.0;
  PVar13 = Transform::operator()(this_00,(Point3<float> *)&local_3f8);
  auVar5._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar12;
  local_410.x = 0.0;
  local_410.y = 0.0;
  local_410.z = 0.0;
  PVar14 = Transform::operator()(this_00,(Point3<float> *)&local_410);
  auVar6._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar12;
  auVar3 = vsubps_avx(auVar5._0_16_,auVar6._0_16_);
  uVar1 = vmovlps_avx(auVar3);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar12 = ZEXT856(0);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z =
       PVar13.super_Tuple3<pbrt::Point3,_float>.z - PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  local_3f8.m.m[0][0] = 0.0;
  local_3f8.m.m[0][1] = 1.0;
  local_3f8.m.m[0][2] = 0.0;
  PVar13 = Transform::operator()(this_00,(Point3<float> *)&local_3f8);
  auVar7._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar12;
  local_410.x = 0.0;
  local_410.y = 0.0;
  local_410.z = 0.0;
  PVar14 = Transform::operator()(this_00,(Point3<float> *)&local_410);
  auVar8._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar12;
  auVar3 = vsubps_avx(auVar7._0_16_,auVar8._0_16_);
  uVar1 = vmovlps_avx(auVar3);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z =
       PVar13.super_Tuple3<pbrt::Point3,_float>.z - PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(*(ulong *)(((this->super_ProjectiveCamera).super_CameraBase.film.
                                        super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                       0xffffffffffff) + 0x18) & 0xffffffffffff);
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar4,auVar3);
  auVar12 = ZEXT856(auVar3._8_8_);
  local_3f8.m.m[0]._0_8_ = vmovlps_avx(auVar3);
  local_3f8.m.m[0][2] = 0.0;
  PVar13 = Transform::operator()(this_00,(Point3<float> *)&local_3f8);
  local_410.z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  local_410._0_8_ = vmovlps_avx(auVar9._0_16_);
  VVar15 = Normalize<float>((Vector3<float> *)&local_410);
  this->cosTotalWidth = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar1 = *(undefined8 *)
           ((this->super_ProjectiveCamera).super_CameraBase.film.
            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff);
  local_410.x = 0.0;
  local_410.y = 0.0;
  local_410.z = 0.0;
  PVar13 = Transform::operator()(this_00,(Point3<float> *)&local_410);
  auVar10._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  auVar12 = ZEXT856(in_XMM4_Qa);
  local_410.y = (float)(int)((ulong)uVar1 >> 0x20);
  local_410.x = (float)(int)uVar1;
  local_410.z = 0.0;
  PVar14 = Transform::operator()(this_00,(Point3<float> *)&local_410);
  auVar11._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar12;
  auVar3 = vmovshdup_avx(auVar11._0_16_);
  local_400.
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           )((ulong)this | 0x1000000000000);
  auVar4 = vmovshdup_avx(auVar10._0_16_);
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx512vl(ZEXT416((uint)((PVar14.super_Tuple3<pbrt::Point3,_float>.x /
                                           PVar14.super_Tuple3<pbrt::Point3,_float>.z -
                                          PVar13.super_Tuple3<pbrt::Point3,_float>.x /
                                          PVar13.super_Tuple3<pbrt::Point3,_float>.z) *
                                         (auVar3._0_4_ / PVar14.super_Tuple3<pbrt::Point3,_float>.z
                                         - auVar4._0_4_ / PVar13.super_Tuple3<pbrt::Point3,_float>.z
                                         ))),auVar2);
  this->A = auVar3._0_4_;
  CameraBase::FindMinimumDifferentials((CameraBase *)this,&local_400);
  return;
}

Assistant:

PerspectiveCamera(CameraBaseParameters baseParameters, Float fov,
                      const Bounds2f &screenWindow, Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Perspective(fov, 1e-2f, 1000.f), screenWindow,
                           lensRadius, focalDistance) {
        // Compute differential changes in origin for perspective camera rays
        dxCamera =
            cameraFromRaster(Point3f(1, 0, 0)) - cameraFromRaster(Point3f(0, 0, 0));
        dyCamera =
            cameraFromRaster(Point3f(0, 1, 0)) - cameraFromRaster(Point3f(0, 0, 0));

        // Compute _cosTotalWidth_ for perspective camera
        Point2f radius = Point2f(film.GetFilter().Radius());
        Point3f pCorner(-radius.x, -radius.y, 0.f);
        Vector3f wCornerCamera = Normalize(Vector3f(cameraFromRaster(pCorner)));
        cosTotalWidth = wCornerCamera.z;
        DCHECK_LT(.9999 * cosTotalWidth, std::cos(Radians(fov / 2)));

        // Compute image plane area at $z=1$ for _PerspectiveCamera_
        Point2i res = film.FullResolution();
        Point3f pMin = cameraFromRaster(Point3f(0, 0, 0));
        Point3f pMax = cameraFromRaster(Point3f(res.x, res.y, 0));
        pMin /= pMin.z;
        pMax /= pMax.z;
        A = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));

        // Compute minimum differentials for _PerspectiveCamera_
        FindMinimumDifferentials(this);
    }